

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Citizen.cpp
# Opt level: O0

void Handlers::Citizen_Reply(Character *character,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  long lVar3;
  mapped_type *this;
  NPC_Data *pNVar4;
  pointer pNVar5;
  reference subject;
  string *local_1f8;
  bool local_1b2;
  bool local_1b1;
  string *local_190;
  undefined1 local_188 [8];
  PacketBuilder reply;
  string local_138;
  int local_114;
  int local_110;
  int i;
  int questions_wrong;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_78 [8];
  string answers [3];
  PacketReader *reader_local;
  Character *character_local;
  
  local_190 = local_78;
  answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code = (size_t)reader;
  do {
    std::__cxx11::string::string(local_190);
    local_190 = local_190 + 0x20;
  } while (local_190 !=
           (string *)
           &answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
            super__Hash_node_code_cache<true>);
  PacketReader::GetShort
            ((PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  PacketReader::GetByte
            ((PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  PacketReader::GetShort
            ((PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  PacketReader::GetByte
            ((PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  PacketReader::GetBreakString_abi_cxx11_
            (&local_a8,
             (PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code,0xff);
  std::__cxx11::string::operator=(local_78,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  PacketReader::GetBreakString_abi_cxx11_
            (&local_c8,
             (PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code,0xff);
  std::__cxx11::string::operator=
            ((string *)
             &answers[0].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  PacketReader::GetEndString_abi_cxx11_
            (&local_e8,
             (PacketReader *)
             answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  std::__cxx11::string::operator=
            ((string *)
             &answers[1].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
              super__Hash_node_code_cache<true>,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  i._2_1_ = 0;
  i._1_1_ = 0;
  local_1b1 = false;
  if (character->npc_type == Inn) {
    lVar3 = std::__cxx11::string::size();
    local_1b2 = true;
    if (lVar3 != 0) {
      pWVar1 = character->world;
      std::allocator<char>::allocator();
      i._2_1_ = 1;
      std::__cxx11::string::string
                ((string *)&questions_wrong,"CitizenSubscribeAnytime",(allocator *)((long)&i + 3));
      i._1_1_ = 1;
      this = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,(key_type *)&questions_wrong);
      local_1b2 = util::variant::operator_cast_to_bool(this);
    }
    local_1b1 = local_1b2;
  }
  if ((i._1_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&questions_wrong);
  }
  if ((i._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  }
  if (local_1b1 != false) {
    local_110 = 0;
    for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
      util::lowercase(&local_138,
                      (string *)
                      &answers[(long)local_114 + -1].
                       super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                       super__Hash_node_code_cache<true>);
      pNVar4 = NPC::Data(character->npc);
      pNVar5 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::operator->
                         (&pNVar4->citizenship);
      subject = std::
                array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                ::operator[](&pNVar5->answers,(long)local_114);
      util::lowercase((string *)&reply.add_size,subject);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_138,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &reply.add_size);
      std::__cxx11::string::~string((string *)&reply.add_size);
      std::__cxx11::string::~string((string *)&local_138);
      if (bVar2) {
        local_110 = local_110 + 1;
      }
    }
    if (local_110 == 0) {
      pNVar4 = NPC::Data(character->npc);
      pNVar5 = std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::operator->
                         (&pNVar4->citizenship);
      std::__cxx11::string::operator=((string *)&character->home,(string *)pNVar5);
    }
    PacketBuilder::PacketBuilder((PacketBuilder *)local_188,PACKET_CITIZEN,PACKET_REPLY,1);
    PacketBuilder::AddChar((PacketBuilder *)local_188,(uchar)local_110);
    Character::Send(character,(PacketBuilder *)local_188);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_188);
  }
  local_1f8 = (string *)
              &answers[2].super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
               super__Hash_node_code_cache<true>;
  do {
    local_1f8 = local_1f8 + -0x20;
    std::__cxx11::string::~string(local_1f8);
  } while (local_1f8 != local_78);
  return;
}

Assistant:

void Citizen_Reply(Character *character, PacketReader &reader)
{
	std::string answers[3];

	/*int session = */reader.GetShort();
	reader.GetByte();
	/*short npcid = */reader.GetShort();
	reader.GetByte();
	answers[0] = reader.GetBreakString();
	answers[1] = reader.GetBreakString();
	answers[2] = reader.GetEndString();

	if (character->npc_type == ENF::Inn && (character->home.size() == 0 || character->world->config["CitizenSubscribeAnytime"]))
	{
		int questions_wrong = 0;

		for (int i = 0; i < 3; ++i)
		{
			if (util::lowercase(answers[i]) != util::lowercase(character->npc->Data().citizenship->answers[i]))
			{
				++questions_wrong;
			}
		}

		if (questions_wrong == 0)
		{
			character->home = character->npc->Data().citizenship->home;
		}

		PacketBuilder reply(PACKET_CITIZEN, PACKET_REPLY, 1);
		reply.AddChar(questions_wrong);

		character->Send(reply);
	}
}